

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
cbor_event_reader<std::__cxx11::istringstream&>(void *param_1)

{
  uint uVar1;
  undefined8 in_R8;
  allocator<char> *in_stack_00000018;
  cbor_decode_options *in_stack_00000020;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_00000030;
  
  ser_context::ser_context((ser_context *)((long)param_1 + 0x2e8));
  basic_staj_event_reader<char>::basic_staj_event_reader((basic_staj_event_reader<char> *)param_1);
  (((basic_item_event_receiver<char> *)param_1)->super_basic_item_event_visitor<char>).
  _vptr_basic_item_event_visitor = (_func_int **)(vtable + 0x18);
  (((basic_item_event_receiver<char> *)((long)param_1 + 0x2a0))->shape_).data_ =
       (pointer)(vtable + 0xb8);
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_cbor_parser<std::__cxx11::istringstream&>
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  basic_item_event_receiver<char>::basic_item_event_receiver
            ((basic_item_event_receiver<char> *)param_1);
  *(undefined1 *)&(((basic_item_event_receiver<char> *)((long)param_1 + 0x2a0))->data_).size_ = 0;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::cursor_mode
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             &((basic_item_event_receiver<char> *)param_1)->event_,true);
  uVar1 = (*(((basic_item_event_receiver<char> *)param_1)->super_basic_item_event_visitor<char>).
            _vptr_basic_item_event_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(((basic_item_event_receiver<char> *)param_1)->super_basic_item_event_visitor<char>).
      _vptr_basic_item_event_visitor[8])(param_1,in_R8);
  }
  return;
}

Assistant:

cbor_event_reader(std::allocator_arg_t, const Allocator& alloc, 
            Sourceable&& source,
            const cbor_decode_options& options,
            std::error_code& ec)
           : parser_(std::forward<Sourceable>(source), options, alloc),
             eof_(false)
        {
            parser_.cursor_mode(true);
            if (!done())
            {
                next(ec);
            }
        }